

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_assignment_operator_set_Test::~ObjectTest_basic_assignment_operator_set_Test
          (ObjectTest_basic_assignment_operator_set_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator_set) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<bool>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<signed char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<unsigned char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<short>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<int>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<long long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<intmax_t>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<float>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<long double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<std::u8string>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::set<object>);
}